

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O2

int __thiscall FluidSynthMIDIDevice::LoadPatchSets(FluidSynthMIDIDevice *this,char *patches)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  _func_int_fluid_synth_t_ptr_char_ptr_int *p_Var3;
  int iVar4;
  FString path;
  FString local_38;
  
  __s = strdup(patches);
  if (__s == (char *)0x0) {
    iVar4 = 0;
  }
  else {
    pcVar2 = strtok(__s,":");
    iVar4 = 0;
    while (pcVar2 != (char *)0x0) {
      path.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      NicePath((char *)&local_38);
      FString::operator=(&path,&local_38);
      FString::~FString(&local_38);
      p_Var3 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_sfload);
      iVar1 = (*p_Var3)(this->FluidSynth,path.Chars,SUB14(iVar4 == 0,0));
      if (iVar1 == -1) {
        DPrintf(1,"Failed to load patch set %s.\n",pcVar2);
      }
      else {
        DPrintf(3,"Loaded patch set %s.\n",pcVar2);
        iVar4 = iVar4 + 1;
      }
      pcVar2 = strtok((char *)0x0,":");
      FString::~FString(&path);
    }
    free(__s);
  }
  return iVar4;
}

Assistant:

int FluidSynthMIDIDevice::LoadPatchSets(const char *patches)
{
	int count;
	char *wpatches = strdup(patches);
	char *tok;
#ifdef _WIN32
	const char *const delim = ";";
#else
	const char *const delim = ":";
#endif

	if (wpatches == NULL)
	{
		return 0;
	}
	tok = strtok(wpatches, delim);
	count = 0;
	while (tok != NULL)
	{
		FString path;
#ifdef _WIN32
		// If the path does not contain any path separators, automatically
		// prepend $PROGDIR to the path.
		if (strcspn(tok, ":/\\") == strlen(tok))
		{
			path << "$PROGDIR/" << tok;
			path = NicePath(path);
		}
		else
#endif
		{
			path = NicePath(tok);
		}
		if (FLUID_FAILED != fluid_synth_sfload(FluidSynth, path, count == 0))
		{
			DPrintf(DMSG_NOTIFY, "Loaded patch set %s.\n", tok);
			count++;
		}
		else
		{
			DPrintf(DMSG_ERROR, "Failed to load patch set %s.\n", tok);
		}
		tok = strtok(NULL, delim);
	}
	free(wpatches);
	return count;
}